

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O3

bool redoable_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *in_value;
  Am_Object undo_handler;
  Am_Object last_command;
  Am_Object local_20;
  Am_Object local_18;
  Am_Object local_10;
  
  local_18.data = (Am_Object_Data *)0x0;
  Am_Object::Am_Object(&local_10,self);
  get_undo_handler(&local_20);
  Am_Object::~Am_Object(&local_10);
  bVar1 = Am_Object::Valid(&local_20);
  if (bVar1) {
    in_value = Am_Object::Get(&local_20,0x179,0);
    Am_Object::operator=(&local_18,in_value);
  }
  bVar1 = Am_Object::Valid(&local_18);
  Am_Object::~Am_Object(&local_20);
  Am_Object::~Am_Object(&local_18);
  return bVar1;
}

Assistant:

Am_Define_Formula(bool, redoable)
{
  Am_Object last_command;
  Am_Object undo_handler = get_undo_handler(self);
  if (undo_handler.Valid())
    last_command = undo_handler.Get(Am_REDO_ALLOWED);
  return last_command.Valid();
}